

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::tanh_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar4;
  
  iVar2 = (*grad->_vptr_tensor[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*dest->_vptr_tensor[2])(dest);
  iVar3 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  lVar1 = dest->m_size;
  if (grad == gradient_input) {
    if (lVar1 != 0) {
      lVar5 = 0;
      do {
        auVar6 = ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar2) + lVar5 * 4));
        auVar6 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
        *(float *)(lVar4 + lVar5 * 4) =
             auVar6._0_4_ * *(float *)(CONCAT44(extraout_var_01,iVar3) + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  else if (lVar1 != 0) {
    lVar5 = 0;
    do {
      auVar6 = ZEXT416(*(uint *)(CONCAT44(extraout_var_00,iVar2) + lVar5 * 4));
      auVar6 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
      auVar6 = vfmadd213ss_fma(auVar6,ZEXT416(*(uint *)(CONCAT44(extraout_var_01,iVar3) + lVar5 * 4)
                                             ),ZEXT416(*(uint *)(lVar4 + lVar5 * 4)));
      *(int *)(lVar4 + lVar5 * 4) = auVar6._0_4_;
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

void tanh_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const auto g = grad.host();
            const auto d = dest.host();
            const auto in = gradient_input.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] = in[i]*(1-d[i]*d[i]);
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] += in[i]*(1-d[i]*d[i]);
            }
        }